

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O3

void fert_stats<dynet::AttentionalModel<dynet::LSTMBuilder>>
               (Model *model,AttentionalModel<dynet::LSTMBuilder> *am,Corpus *devel,bool global_fert
               )

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  undefined7 in_register_00000009;
  pointer ptVar5;
  ulong uVar6;
  bool bVar7;
  Sentence ssent;
  Sentence tsent;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if ((int)CONCAT71(in_register_00000009,global_fert) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"==== FERTILITY ESTIMATES ====\n",0x1e);
    ptVar5 = (devel->
             super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((devel->
        super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != ptVar5) {
      uVar4 = 0;
      uVar6 = 1;
      do {
        std::vector<int,_std::allocator<int>_>::operator=
                  (&local_68,
                   &ptVar5[uVar4].
                    super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                    .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl);
        std::vector<int,_std::allocator<int>_>::operator=
                  (&local_48,
                   &ptVar5[uVar4].
                    super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                    .super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                    super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl);
        iVar1 = ptVar5[uVar4].
                super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                .super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"=== sentence ",0xd);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ===\n",6);
        dynet::AttentionalModel<dynet::LSTMBuilder>::display_fertility(am,&local_68,&sd);
        ptVar5 = (devel->
                 super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar4 = ((long)(devel->
                       super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)ptVar5 >> 3) *
                0x6db6db6db6db6db7;
        bVar7 = uVar6 <= uVar4;
        lVar2 = uVar4 - uVar6;
        uVar4 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar7 && lVar2 != 0);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==== EMPIRICAL FERTILITY VALUES ====\n",0x25);
  ptVar5 = (devel->
           super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((devel->
      super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ptVar5) {
    uVar4 = 0;
    uVar6 = 1;
    do {
      std::vector<int,_std::allocator<int>_>::operator=
                (&local_68,
                 &ptVar5[uVar4].
                  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl
                );
      std::vector<int,_std::allocator<int>_>::operator=
                (&local_48,
                 &ptVar5[uVar4].
                  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  .super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                  super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl)
      ;
      iVar1 = ptVar5[uVar4].
              super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
              .super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
              super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"=== sentence ",0xd);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ===\n",6);
      dynet::AttentionalModel<dynet::LSTMBuilder>::display_empirical_fertility
                (am,&local_68,&local_48,&sd);
      ptVar5 = (devel->
               super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(devel->
                     super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)ptVar5 >> 3) *
              0x6db6db6db6db6db7;
      bVar7 = uVar6 <= uVar4;
      lVar2 = uVar4 - uVar6;
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar7 && lVar2 != 0);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void fert_stats(Model &model, AM_t &am, Corpus &devel, bool global_fert)
{
    Sentence ssent, tsent;
    int docid;

    if (global_fert) {
        std::cout << "==== FERTILITY ESTIMATES ====\n";
        for (unsigned i = 0; i < devel.size(); ++i) {
            tie(ssent, tsent, docid) = devel[i];
            std::cout << "=== sentence " << i << " (" << docid << ") ===\n";
            am.display_fertility(ssent, sd);
        }
    }

    std::cout << "==== EMPIRICAL FERTILITY VALUES ====\n";
    for (unsigned i = 0; i < devel.size(); ++i) {
        tie(ssent, tsent, docid) = devel[i];
        std::cout << "=== sentence " << i << " (" << docid << ") ===\n";
        am.display_empirical_fertility(ssent, tsent, sd);
    }
}